

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O0

keycode_t borg_inkey(_Bool take)

{
  wchar_t i;
  _Bool take_local;
  
  if (borg_key_head == borg_key_tail) {
    i = L'\0';
  }
  else {
    i = borg_key_queue[borg_key_tail];
    if ((take) && (borg_key_tail = borg_key_tail + 1, borg_key_tail == 0x2000)) {
      borg_key_tail = 0;
    }
  }
  return i;
}

Assistant:

keycode_t borg_inkey(bool take)
{
    int i;

    /* Nothing ready */
    if (borg_key_head == borg_key_tail)
        return 0;

    /* Extract the keypress */
    i = borg_key_queue[borg_key_tail];

    /* Do not advance */
    if (!take)
        return i;

    /* Advance the queue */
    borg_key_tail++;

    /* Circular queue requires wrap-around */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Return the key */
    return i;
}